

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O1

SUNAdaptController SUNAdaptController_Soderlind(SUNContext_conflict sunctx)

{
  SUNAdaptController_Ops p_Var1;
  SUNAdaptController p_Var2;
  undefined8 *puVar3;
  
  p_Var2 = (SUNAdaptController)SUNAdaptController_NewEmpty();
  p_Var1 = p_Var2->ops;
  p_Var1->gettype = SUNAdaptController_GetType_Soderlind;
  p_Var1->estimatestep = SUNAdaptController_EstimateStep_Soderlind;
  p_Var1->reset = SUNAdaptController_Reset_Soderlind;
  p_Var1->setdefaults = SUNAdaptController_SetDefaults_Soderlind;
  p_Var1->write = SUNAdaptController_Write_Soderlind;
  p_Var1->seterrorbias = SUNAdaptController_SetErrorBias_Soderlind;
  p_Var1->updateh = SUNAdaptController_UpdateH_Soderlind;
  p_Var1->space = SUNAdaptController_Space_Soderlind;
  puVar3 = (undefined8 *)malloc(0x58);
  p_Var2->content = puVar3;
  *puVar3 = 0x3ff4000000000000;
  puVar3[1] = 0x3fe0000000000000;
  puVar3[2] = 0xbfe8000000000000;
  puVar3[3] = 0x3fd0000000000000;
  puVar3[4] = 0x3fe8000000000000;
  puVar3[5] = 0x3ff0000000000000;
  puVar3[6] = 0x3ff0000000000000;
  puVar3[7] = 0x3ff0000000000000;
  puVar3[8] = 0x3ff0000000000000;
  puVar3[9] = 0x3ff0000000000000;
  puVar3[10] = 0x200000000;
  return p_Var2;
}

Assistant:

SUNAdaptController SUNAdaptController_Soderlind(SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);

  /* Create an empty controller object */
  SUNAdaptController C = SUNAdaptController_NewEmpty(sunctx);
  SUNCheckLastErrNull();
  SUNAdaptControllerContent_Soderlind content = NULL;

  /* Attach operations */
  C->ops->gettype      = SUNAdaptController_GetType_Soderlind;
  C->ops->estimatestep = SUNAdaptController_EstimateStep_Soderlind;
  C->ops->reset        = SUNAdaptController_Reset_Soderlind;
  C->ops->setdefaults  = SUNAdaptController_SetDefaults_Soderlind;
  C->ops->write        = SUNAdaptController_Write_Soderlind;
  C->ops->seterrorbias = SUNAdaptController_SetErrorBias_Soderlind;
  C->ops->updateh      = SUNAdaptController_UpdateH_Soderlind;
  C->ops->space        = SUNAdaptController_Space_Soderlind;

  /* Create content */
  content = (SUNAdaptControllerContent_Soderlind)malloc(sizeof(*content));
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);
  C->content = content;

  /* Fill content with default/reset values */
  SUNCheckCallNull(SUNAdaptController_SetDefaults_Soderlind(C));
  SUNCheckCallNull(SUNAdaptController_Reset_Soderlind(C));

  return (C);
}